

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

CompoundString * __thiscall Js::CompoundString::Clone(CompoundString *this,bool forAppending)

{
  JavascriptLibrary *this_00;
  Recycler *pRVar1;
  CompoundString *this_01;
  TrackAllocData local_40;
  byte local_11;
  CompoundString *pCStack_10;
  bool forAppending_local;
  CompoundString *this_local;
  
  local_11 = forAppending;
  pCStack_10 = this;
  this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
  pRVar1 = JavascriptLibrary::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
             ,0x245);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_40);
  this_01 = (CompoundString *)new<Memory::Recycler>(0x40,pRVar1,0x43c4b0);
  CompoundString(this_01,this,(bool)(local_11 & 1));
  return this_01;
}

Assistant:

CompoundString *CompoundString::Clone(const bool forAppending)
    {
        return RecyclerNew(GetLibrary()->GetRecycler(), CompoundString, *this, forAppending);
    }